

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  uint64_t uVar1;
  bool bVar2;
  Location local_58;
  TableModuleField *local_38;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_30;
  
  GetLocation(&local_58,this);
  MakeUnique<wabt::TableModuleField,wabt::Location>((wabt *)&local_38,&local_58);
  bVar2 = elem_limits->is_shared;
  (local_38->table).elem_limits.has_max = elem_limits->has_max;
  (local_38->table).elem_limits.is_shared = bVar2;
  uVar1 = elem_limits->max;
  (local_38->table).elem_limits.initial = elem_limits->initial;
  (local_38->table).elem_limits.max = uVar1;
  local_30._M_head_impl = local_38;
  local_38 = (TableModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       *)&local_30);
  if (local_30._M_head_impl != (TableModuleField *)0x0) {
    (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_30._M_head_impl = (TableModuleField *)0x0;
  if (local_38 != (TableModuleField *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}